

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::setCapacity
          (Vector<capnp::compiler::NodeTranslator::UnfinishedValue> *this,size_t newSize)

{
  long lVar1;
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> newBuilder;
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> local_30;
  
  lVar1 = (long)(this->builder).pos - (long)(this->builder).ptr;
  if (newSize < (ulong)(lVar1 / 0x98)) {
    ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::truncate
              (&this->builder,(char *)newSize,lVar1 % 0x98);
  }
  local_30.ptr = kj::_::HeapArrayDisposer::
                 allocateUninitialized<capnp::compiler::NodeTranslator::UnfinishedValue>(newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::
  addAll<kj::ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>>
            (&local_30,&this->builder);
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::operator=
            (&this->builder,&local_30);
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }